

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Insert<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
::TestBody(Insert<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  bool *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  mt19937_64 *__urng;
  long lVar4;
  char *pcVar5;
  tuple<const_int_&> *args_1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *args_1_00;
  T val2;
  T val;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_7b0;
  AssertHelper local_7a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_798;
  undefined1 local_790 [8];
  undefined1 local_788 [8];
  _Head_base<0UL,_const_int_&,_false> _Stack_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  ctrl_t *local_768;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_760;
  bool local_758 [8];
  AssertHelper local_750;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
  local_748;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_710;
  
  local_790 = (undefined1  [8])
              hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()
                        ((Generator<std::pair<const_int,_int>,_void> *)&local_710);
  lVar4 = 0x68;
  do {
    *(undefined8 *)((long)&local_748.first.inner_ + lVar4) = 0;
    *(undefined8 *)((long)local_710.sets_._M_elems + lVar4 + -0x30) = 0;
    pbVar1 = local_758 + lVar4;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    *(undefined8 *)((long)&local_750.data_ + lVar4) = 0;
    *(undefined8 *)((long)&local_768 + lVar4) = 0;
    pbVar1 = local_758 + lVar4 + -8;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    *(undefined8 *)((long)&local_778 + lVar4) = 0;
    *(undefined8 *)((long)&local_778 + lVar4 + 8) = 0;
    *(undefined8 *)((long)local_710.sets_._M_elems + lVar4 + -0x28) = 0;
    *(undefined8 *)((long)local_710.sets_._M_elems + lVar4 + -0x18) = 0;
    *(long *)((long)local_710.sets_._M_elems + lVar4 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_710.sets_._M_elems + lVar4 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_710.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar4) = 0;
    lVar4 = lVar4 + 0x70;
  } while (lVar4 != 0x768);
  _Stack_780._M_head_impl = (int *)(local_790 + 4);
  local_788 = (undefined1  [8])local_790;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_790._0_4_;
  args_1 = (tuple<const_int_&> *)local_788;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int_const&>>
            (&local_748,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_710,(int *)local_788,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,args_1,
             (tuple<const_int_&> *)&_Stack_780);
  local_7a0._M_head_impl._0_1_ = local_748.second;
  local_798 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_748.second == false) {
    testing::Message::Message((Message *)&local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_788,(internal *)&local_7a0,(AssertionResult *)"p.second","false",
               "true",(char *)args_1);
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x39,(char *)local_788);
    testing::internal::AssertHelper::operator=(&local_7b0,(Message *)&local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    if (local_788 != (undefined1  [8])&local_778) {
      operator_delete((void *)local_788,(ulong)(local_778._0_8_ + 1));
    }
    if ((long *)CONCAT44(local_7a8.data_._4_4_,(int)local_7a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_7a8.data_._4_4_,(int)local_7a8.data_) + 8))();
    }
    if (local_798 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_798,local_798);
    }
  }
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_788,"val","*p.first",(pair<const_int,_int> *)local_790,
             (pair<const_int,_int> *)local_748.first.it_.field_1.slot_);
  if (local_788[0] == '\0') {
    testing::Message::Message((Message *)&local_7a0);
    if ((Inner *)_Stack_780._M_head_impl == (Inner *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)_Stack_780._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_7a8,(Message *)&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    if (local_7a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7a0._M_head_impl + 8))();
    }
  }
  if ((Inner *)_Stack_780._M_head_impl != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_780,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_780._M_head_impl);
  }
  local_788 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  local_7a8.data_._4_4_ =
       std::uniform_int_distribution<int>::operator()
                 ((uniform_int_distribution<int> *)local_788,__urng,(param_type *)local_788);
  local_798 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&local_7a8.data_ + 4);
  local_7a8.data_._0_4_ = local_790._0_4_;
  local_7a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7a8;
  args_1_00 = &local_7a0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)local_790._0_4_;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
              *)local_788,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_710,(int *)local_7a0._M_head_impl,
             SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,(tuple<const_int_&> *)args_1_00,
             (tuple<const_int_&> *)&local_798);
  local_748.first.inner_ = (Inner *)local_788;
  local_748.first.inner_end_ = (Inner *)_Stack_780._M_head_impl;
  local_748.first.it_.ctrl_ = (ctrl_t *)local_778._0_8_;
  local_748.first.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_778._8_8_;
  local_748.first.it_end_.ctrl_ = local_768;
  local_748.first.it_end_.field_1 = aStack_760;
  local_748.second = local_758[0];
  local_7a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_7a0._M_head_impl._1_7_,local_758[0]) ^ 1);
  local_798 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_758[0] != false) {
    testing::Message::Message((Message *)&local_7b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_788,(internal *)&local_7a0,(AssertionResult *)"p.second","true",
               "false",(char *)args_1_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3d,(char *)local_788);
    testing::internal::AssertHelper::operator=(&local_750,(Message *)&local_7b0);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    if (local_788 != (undefined1  [8])&local_778) {
      operator_delete((void *)local_788,(ulong)(local_778._0_8_ + 1));
    }
    if (local_7b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_7b0.data_ + 8))();
    }
    if (local_798 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_798,local_798);
    }
  }
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_788,"val","*p.first",(pair<const_int,_int> *)local_790,
             (pair<const_int,_int> *)local_748.first.it_.field_1.slot_);
  if (local_788[0] == '\0') {
    testing::Message::Message((Message *)&local_7a0);
    if ((Inner *)_Stack_780._M_head_impl == (Inner *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)_Stack_780._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_7b0,(Message *)&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    if (local_7a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7a0._M_head_impl + 8))();
    }
  }
  if ((Inner *)_Stack_780._M_head_impl != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_780,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_780._M_head_impl);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_710);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Insert) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto p = m.insert(val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.insert(val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
}